

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedSelfAdjointEigenSolver.h
# Opt level: O1

GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::compute
          (GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,
          MatrixType *matA,MatrixType *matB,int options)

{
  bool *pbVar1;
  long lVar2;
  long lVar3;
  char *__function;
  ActualDstType actualDst;
  void *__ptr;
  uint uVar4;
  SrcXprType local_a8;
  void *local_98;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> cholB;
  MatrixType matC;
  type tmp;
  assign_op<double,_double> local_31;
  
  lVar2 = (matA->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((((matA->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
        lVar2) ||
      (lVar3 = (matB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows, lVar3 != lVar2)) ||
     ((matB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      lVar3)) {
    __assert_fail("matA.cols()==matA.rows() && matB.rows()==matA.rows() && matB.cols()==matB.rows()"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Eigenvalues/GeneralizedSelfAdjointEigenSolver.h"
                  ,0xa5,
                  "GeneralizedSelfAdjointEigenSolver<MatrixType> &Eigen::GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double, -1, -1>>::compute(const MatrixType &, const MatrixType &, int) [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((((options & 0xfffff83fU) != 0) || ((options & 0xc0U) == 0xc0)) || (4 < (uint)options >> 8)) {
switchD_00111e78_caseD_3:
    __assert_fail("(options&~(EigVecMask|GenEigMask))==0 && (options&EigVecMask)!=EigVecMask && ((options&GenEigMask)==0 || (options&GenEigMask)==Ax_lBx || (options&GenEigMask)==ABx_lx || (options&GenEigMask)==BAx_lx) && \"invalid option parameter\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Eigenvalues/GeneralizedSelfAdjointEigenSolver.h"
                  ,0xaa,
                  "GeneralizedSelfAdjointEigenSolver<MatrixType> &Eigen::GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double, -1, -1>>::compute(const MatrixType &, const MatrixType &, int) [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  uVar4 = options & 0x700;
  switch((uint)options >> 8) {
  case 0:
    uVar4 = 0x100;
    break;
  case 3:
    goto switchD_00111e78_caseD_3;
  }
  LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&local_98,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matB);
  if (uVar4 == 0x100) {
    cholB._32_8_ = matA;
    PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::SelfAdjointView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
               &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,(EigenBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                        *)&cholB.m_isInitialized);
    if (cholB.m_l1_norm._0_1_ == '\0') {
LAB_00112225:
      __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Cholesky/LLT.h"
                    ,0x80,
                    "typename Traits::MatrixL Eigen::LLT<Eigen::Matrix<double, -1, -1>>::matrixL() const [MatrixType = Eigen::Matrix<double, -1, -1>, UpLo = 1]"
                   );
    }
    cholB._32_8_ = (non_const_type)&local_98;
    TriangularViewImpl<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1u,Eigen::Dense>::
    solveInPlace<1,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((TriangularViewImpl<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u,Eigen::Dense> *)
               &cholB.m_isInitialized,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols);
    if (cholB.m_l1_norm._0_1_ == '\0') {
LAB_00112206:
      __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Cholesky/LLT.h"
                    ,0x79,
                    "typename Traits::MatrixU Eigen::LLT<Eigen::Matrix<double, -1, -1>>::matrixU() const [MatrixType = Eigen::Matrix<double, -1, -1>, UpLo = 1]"
                   );
    }
    cholB._32_8_ = (non_const_type)&local_98;
    TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
    ::solveInPlace<2,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                *)&cholB.m_isInitialized,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols);
    SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,(uint)((options & 0x40U) == 0) * 0x40 + 0x40);
    __ptr = (void *)matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols;
    if ((options & 0x40U) == 0) {
      if (cholB.m_l1_norm._0_1_ == '\0') goto LAB_00112206;
      cholB._32_8_ = (non_const_type)&local_98;
      TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
      ::solveInPlace<1,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                  *)&cholB.m_isInitialized,
                 (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
      __ptr = (void *)matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols;
    }
  }
  else if (uVar4 == 0x200) {
    pbVar1 = &cholB.m_isInitialized;
    matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)matA;
    PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::SelfAdjointView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pbVar1,
               (EigenBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                *)&matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                   m_cols);
    if (cholB.m_l1_norm._0_1_ == '\0') goto LAB_00112225;
    if ((double *)
        matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows !=
        cholB.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data) {
LAB_00112244:
      __function = 
      "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::TriangularView<const Eigen::Matrix<double, -1, -1>, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::Matrix<double, -1, -1>, _Rhs = Eigen::TriangularView<const Eigen::Matrix<double, -1, -1>, 1>, Option = 0]"
      ;
LAB_00112270:
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/Product.h"
                    ,0x61,__function);
    }
    matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    local_a8.m_lhs.m_matrix.m_matrix = (MatrixTypeNested)(MatrixTypeNested)pbVar1;
    local_a8.m_rhs = (non_const_type)&local_98;
    internal::
    Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,__1,__1,_0,__1,__1> *)
          &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
          (SrcXprType *)&local_a8,&local_31);
    internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)pbVar1,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,&local_31);
    free((void *)matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
    if (cholB.m_l1_norm._0_1_ == '\0') goto LAB_00112206;
    if (cholB.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data != matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_data) {
LAB_0011225b:
      __function = 
      "Eigen::Product<Eigen::TriangularView<const Eigen::Transpose<const Eigen::Matrix<double, -1, -1>>, 2>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::TriangularView<const Eigen::Transpose<const Eigen::Matrix<double, -1, -1>>, 2>, _Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
      ;
      goto LAB_00112270;
    }
    matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    local_a8.m_lhs.m_matrix.m_matrix = (MatrixTypeNested)(MatrixTypeNested)&local_98;
    local_a8.m_rhs = (RhsNested)pbVar1;
    internal::
    Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_2U>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,__1,__1,_0,__1,__1> *)
          &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
          &local_a8,&local_31);
    internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)&cholB.m_isInitialized,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,&local_31);
    free((void *)matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
    SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&cholB.m_isInitialized,
               (uint)((options & 0x40U) == 0) * 0x40 + 0x40);
    __ptr = (void *)cholB._32_8_;
    if ((options & 0x40U) == 0) {
      if (cholB.m_l1_norm._0_1_ == '\0') goto LAB_00112206;
      matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           (Index)&local_98;
      TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
      ::solveInPlace<1,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                  *)&matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                     .m_cols,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
      __ptr = (void *)cholB._32_8_;
    }
  }
  else {
    if (uVar4 != 0x400) goto LAB_001121aa;
    pbVar1 = &cholB.m_isInitialized;
    matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)matA;
    PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::SelfAdjointView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pbVar1,
               (EigenBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                *)&matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                   m_cols);
    if (cholB.m_l1_norm._0_1_ == '\0') goto LAB_00112225;
    if ((double *)
        matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows !=
        cholB.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data) goto LAB_00112244;
    matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    local_a8.m_lhs.m_matrix.m_matrix = (MatrixTypeNested)(MatrixTypeNested)pbVar1;
    local_a8.m_rhs = (non_const_type)&local_98;
    internal::
    Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,__1,__1,_0,__1,__1> *)
          &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
          (SrcXprType *)&local_a8,&local_31);
    internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)pbVar1,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,&local_31);
    free((void *)matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
    if (cholB.m_l1_norm._0_1_ == '\0') goto LAB_00112206;
    if (cholB.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data != matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_data) goto LAB_0011225b;
    matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    local_a8.m_lhs.m_matrix.m_matrix = (MatrixTypeNested)(MatrixTypeNested)&local_98;
    local_a8.m_rhs = (RhsNested)pbVar1;
    internal::
    Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_2U>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,__1,__1,_0,__1,__1> *)
          &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
          &local_a8,&local_31);
    internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)&cholB.m_isInitialized,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,&local_31);
    free((void *)matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
    SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&cholB.m_isInitialized,
               (uint)((options & 0x40U) == 0) * 0x40 + 0x40);
    __ptr = (void *)cholB._32_8_;
    if ((options & 0x40U) == 0) {
      if (cholB.m_l1_norm._0_1_ == '\0') goto LAB_00112225;
      if (cholB.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows != (this->super_SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows) {
        __function = 
        "Eigen::Product<Eigen::TriangularView<const Eigen::Matrix<double, -1, -1>, 1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::TriangularView<const Eigen::Matrix<double, -1, -1>, 1>, _Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
        ;
        goto LAB_00112270;
      }
      matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
      local_a8.m_lhs.m_matrix.m_matrix = (MatrixTypeNested)(MatrixTypeNested)&local_98;
      local_a8.m_rhs = (RhsNested)this;
      internal::
      Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,__1,__1,_0,__1,__1> *)
            &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
            (SrcXprType *)&local_a8,&local_31);
      internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)this,
                 (Matrix<double,__1,__1,_0,__1,__1> *)
                 &matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols,&local_31);
      free((void *)matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                   m_cols);
      __ptr = (void *)cholB._32_8_;
    }
  }
  free(__ptr);
LAB_001121aa:
  free(local_98);
  return this;
}

Assistant:

GeneralizedSelfAdjointEigenSolver<MatrixType>& GeneralizedSelfAdjointEigenSolver<MatrixType>::
compute(const MatrixType& matA, const MatrixType& matB, int options)
{
  eigen_assert(matA.cols()==matA.rows() && matB.rows()==matA.rows() && matB.cols()==matB.rows());
  eigen_assert((options&~(EigVecMask|GenEigMask))==0
          && (options&EigVecMask)!=EigVecMask
          && ((options&GenEigMask)==0 || (options&GenEigMask)==Ax_lBx
           || (options&GenEigMask)==ABx_lx || (options&GenEigMask)==BAx_lx)
          && "invalid option parameter");

  bool computeEigVecs = ((options&EigVecMask)==0) || ((options&EigVecMask)==ComputeEigenvectors);

  // Compute the cholesky decomposition of matB = L L' = U'U
  LLT<MatrixType> cholB(matB);

  int type = (options&GenEigMask);
  if(type==0)
    type = Ax_lBx;

  if(type==Ax_lBx)
  {
    // compute C = inv(L) A inv(L')
    MatrixType matC = matA.template selfadjointView<Lower>();
    cholB.matrixL().template solveInPlace<OnTheLeft>(matC);
    cholB.matrixU().template solveInPlace<OnTheRight>(matC);

    Base::compute(matC, computeEigVecs ? ComputeEigenvectors : EigenvaluesOnly );

    // transform back the eigen vectors: evecs = inv(U) * evecs
    if(computeEigVecs)
      cholB.matrixU().solveInPlace(Base::m_eivec);
  }
  else if(type==ABx_lx)
  {
    // compute C = L' A L
    MatrixType matC = matA.template selfadjointView<Lower>();
    matC = matC * cholB.matrixL();
    matC = cholB.matrixU() * matC;

    Base::compute(matC, computeEigVecs ? ComputeEigenvectors : EigenvaluesOnly);

    // transform back the eigen vectors: evecs = inv(U) * evecs
    if(computeEigVecs)
      cholB.matrixU().solveInPlace(Base::m_eivec);
  }
  else if(type==BAx_lx)
  {
    // compute C = L' A L
    MatrixType matC = matA.template selfadjointView<Lower>();
    matC = matC * cholB.matrixL();
    matC = cholB.matrixU() * matC;

    Base::compute(matC, computeEigVecs ? ComputeEigenvectors : EigenvaluesOnly);

    // transform back the eigen vectors: evecs = L * evecs
    if(computeEigVecs)
      Base::m_eivec = cholB.matrixL() * Base::m_eivec;
  }

  return *this;
}